

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenNum(Lexer *this)

{
  int iVar1;
  size_t sVar2;
  Lexer *in_RSI;
  Error<pfederc::LexerErrorCode> *local_40;
  Position local_38;
  
  if (in_RSI->currentChar == 0x30) {
    nextChar(in_RSI);
    iVar1 = in_RSI->currentChar;
    if (iVar1 == 0x78) {
      nextTokenHexNum(this);
    }
    else if (iVar1 == 0x6f) {
      nextTokenOctNum(this);
    }
    else if (iVar1 == 0x62) {
      nextTokenBinNum(this);
    }
    else if (iVar1 - 0x30U < 10) {
      getCurrentCursor(&local_38,in_RSI);
      sVar2 = in_RSI->currentStartIndex;
      local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
      local_40->logLevel = LVL_ERROR;
      local_40->err = LEX_ERR_NUM_LEADING_ZERO;
      (local_40->pos).line = local_38.line;
      (local_40->pos).startIndex = sVar2;
      (local_40->pos).endIndex = sVar2;
      (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                          *)in_RSI);
      if (local_40 != (Error<pfederc::LexerErrorCode> *)0x0) {
        std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_40,local_40);
      }
    }
    else if (iVar1 == 0x2e) {
      nextTokenFltNum(this,(size_t)in_RSI);
    }
    else {
      nextTokenNumType(this,(uint64_t)in_RSI);
    }
  }
  else {
    nextTokenDecNum(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenNum() noexcept {
  if (currentChar == '0') {
    nextChar(); // eat 0
    switch (currentChar) {
    case 'b':
      return nextTokenBinNum();
    case 'o':
      return nextTokenOctNum();
    case 'x':
      return nextTokenHexNum();
    default:
      if (isdigit(currentChar)) {
        return generateError(std::make_unique<LexerError>(LVL_ERROR,
          LexerErrorCode::LEX_ERR_NUM_LEADING_ZERO, Position{getCurrentCursor().line,
            currentStartIndex, currentStartIndex}));
      } else if (currentChar == '.') {
        return nextTokenFltNum(0);
      }

      return nextTokenNumType(0);
    }
  }

  return nextTokenDecNum();
}